

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

int pce_load_map(char *fname,int mode)

{
  t_symbol *ptVar1;
  FILE *__stream;
  int size;
  uint size_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uchar header [16];
  int local_48;
  undefined4 local_44;
  int local_40;
  
  __stream = (FILE *)open_file(fname,"rb");
  if (__stream == (FILE *)0x0) {
    fatal_error("Can not open file!");
    mode = 1;
  }
  else {
    fread(&local_48,1,0xc,__stream);
    if ((local_48 == 0x4d524f46) && (local_40 == 0x50414d46)) {
      uVar2 = local_44 >> 0x18 | (local_44 & 0xff0000) >> 8 | (local_44 & 0xff00) << 8 |
              local_44 << 0x18;
      labldef(loccnt,1);
      if (pass == 1) {
        loadlc(loccnt,0);
      }
      size = 0;
      if (4 < (int)uVar2) {
        iVar3 = uVar2 - 4;
        do {
          fread(&local_48,1,8,__stream);
          uVar5 = (ulong)local_44._3_1_ |
                  (ulong)local_44._2_1_ << 8 |
                  (long)(int)(local_44 << 0x18) | (ulong)local_44._1_1_ << 0x10;
          uVar2 = (uint)uVar5;
          iVar3 = (iVar3 - uVar2) + -8;
          size = 0;
          if (iVar3 < 0) break;
          if (local_48 == 0x59444f42) {
            size = (int)((uint)local_44._3_1_ |
                        (uint)((ulong)local_44._2_1_ << 8) |
                        local_44 << 0x18 | (uint)((ulong)local_44._1_1_ << 0x10)) >> 1;
            if (pass == 1) {
              while (uVar2 != 0) {
                iVar4 = (int)uVar5;
                iVar3 = 0x200;
                if (iVar4 < 0x200) {
                  iVar3 = iVar4;
                }
                fread(buffer,1,(long)iVar3,__stream);
                size_00 = iVar3 >> 1;
                if (0 < (int)size_00) {
                  uVar5 = 0;
                  do {
                    buffer[uVar5] = (char)(*(ushort *)(buffer + uVar5 * 2) >> 5) + 0xff;
                    uVar5 = uVar5 + 1;
                  } while (size_00 != uVar5);
                }
                uVar2 = iVar4 - iVar3;
                uVar5 = (ulong)uVar2;
                putbuffer(buffer,size_00);
              }
            }
            else {
              putbuffer((void *)0x0,size);
            }
            break;
          }
          fseek(__stream,uVar5,1);
        } while (iVar3 != 0);
      }
      fclose(__stream);
      ptVar1 = lablptr;
      if (lablptr == (t_symbol *)0x0) {
        if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 7)) {
          lastlabl->data_size = lastlabl->data_size + size;
        }
      }
      else {
        lablptr->data_type = 7;
        ptVar1->data_size = size;
      }
      mode = 1;
      if (pass == 1) {
        println();
      }
    }
    else {
      if (mode != 0) {
        fatal_error("Invalid FMP format!");
      }
      fclose(__stream);
    }
  }
  return mode;
}

Assistant:

int
pce_load_map(char *fname, int mode)
{
	FILE *fp;
	unsigned char header[16];
	int fsize;
	int size;
	int nb;
	int cnt;
	int i, j;

	/* init */
	cnt = 0;

	/* open the file */
	if ((fp = open_file(fname, "rb")) == NULL) {
		fatal_error("Can not open file!");
		return (1);
	}

	/* check FMP header */
	fread(header, 1, 12, fp);
	fsize = (header[4] << 24) +
			(header[5] << 16) +
			(header[6] <<  8) +
			 header[7] - 4;

	if (memcmp(header, "FORM", 4) || memcmp(&header[8], "FMAP", 4)) {
		/* incorrect header */
		if (mode)
			fatal_error("Invalid FMP format!");
		fclose(fp);
		return(mode);
	}

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* browse chunks */
	while (fsize > 0) {
		fread(header, 1, 8, fp);
		size = (header[4] << 24) +
			   (header[5] << 16) +
			   (header[6] <<  8) +
			    header[7];
		fsize -= 8;
		fsize -= size;
		if (fsize < 0)
			break;

		/* BODY chunk */
		if (memcmp(header, "BODY", 4) == 0) {
			/* add size */
			cnt += (size >> 1);

			if (pass == LAST_PASS) {
				/* read chunk */
				while (size) {
					/* read a block */
					nb = (size > 512) ? 512 : size;
					fread(buffer, 1, nb, fp);
					size -= nb;
					nb >>= 1;

					/* convert word -> byte */
					for (i = 0, j = 0; i < nb; i++, j += 2)
						buffer[i] = ((buffer[j] + (buffer[j+1] << 8)) >> 5) - 1;

					/* output buffer */
					putbuffer(buffer, nb);
				}
			}
			else
				putbuffer(NULL, size >> 1);

			/* ok */
			break;
		}
		else {
			/* unsupported chunk */
			fseek(fp, size, SEEK_CUR);
		}
	}

	/* close file */
	fclose(fp);

	/* size */
	if (lablptr) {
		lablptr->data_type = P_INCBIN;
		lablptr->data_size = cnt;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_INCBIN)
				lastlabl->data_size += cnt;
		}
	}

	/* output line */
	if (pass == LAST_PASS)
		println();

	/* ok */
	return (1);
}